

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall cmCTestTestHandler::ProcessOptions(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int level;
  ostream *poVar3;
  char *msg;
  string *psVar4;
  allocator<char> local_639;
  string local_638;
  string *local_618;
  allocator<char> local_609;
  string local_608;
  string *local_5e8;
  allocator<char> local_5d9;
  string local_5d8;
  string *local_5b8;
  allocator<char> local_5a9;
  string local_5a8;
  string *local_588;
  allocator<char> local_579;
  string local_578;
  string *local_558;
  allocator<char> local_549;
  string local_548;
  string *local_528;
  allocator<char> local_519;
  string local_518;
  cmValue local_4f8;
  cmValue val;
  string local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  allocator<char> local_4a9;
  string local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  allocator<char> local_469;
  string local_468;
  cmValue local_448;
  allocator<char> local_439;
  string local_438;
  cmValue local_418;
  allocator<char> local_409;
  string local_408;
  cmValue local_3e8;
  int local_3dc;
  string local_3d8 [32];
  string *local_3b8;
  undefined1 local_3b0 [8];
  ostringstream cmCTestLog_msg;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  string *mode;
  unsigned_long n;
  string *local_1e8;
  string *count;
  RegularExpression repeatRegex;
  string local_108;
  cmValue local_e8;
  cmValue repeat;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  string *local_90;
  allocator<char> local_81;
  string local_80;
  string *local_60;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  cmCTestTestHandler *local_18;
  cmCTestTestHandler *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"TestsToRunInformation",&local_41);
  local_20 = (string *)
             cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_40);
  SetTestsToRunInformation(this,(cmValue)local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"UseUnion",&local_81);
  local_60 = (string *)
             cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_80);
  bVar2 = cmIsOn((cmValue)local_60);
  SetUseUnion(this,bVar2);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"ScheduleRandom",&local_b1)
  ;
  local_90 = (string *)
             cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_b0);
  bVar2 = cmIsOn((cmValue)local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Random",(allocator<char> *)((long)&repeat.Value + 7));
    cmCTest::SetScheduleType(pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&repeat.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Repeat",(allocator<char> *)&repeatRegex.field_0xcf);
  local_e8 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&repeatRegex.field_0xcf);
  bVar2 = cmValue::operator_cast_to_bool(&local_e8);
  if (bVar2) {
    cmsys::RegularExpression::RegularExpression
              ((RegularExpression *)&count,"^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    psVar4 = cmValue::operator_cast_to_string_(&local_e8);
    bVar2 = cmsys::RegularExpression::find((RegularExpression *)&count,psVar4);
    if (bVar2) {
      cmsys::RegularExpression::match_abi_cxx11_((string *)&n,(RegularExpression *)&count,2);
      local_1e8 = (string *)&n;
      mode = (string *)0x1;
      cmStrToULong(local_1e8,(unsigned_long *)&mode);
      this->RepeatCount = (int)mode;
      if (1 < this->RepeatCount) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_238,(RegularExpression *)&count,1);
        local_218 = &local_238;
        bVar2 = std::operator==(local_218,"UNTIL_FAIL");
        if (bVar2) {
          this->RepeatMode = UntilFail;
        }
        else {
          bVar2 = std::operator==(local_218,"UNTIL_PASS");
          if (bVar2) {
            this->RepeatMode = UntilPass;
          }
          else {
            bVar2 = std::operator==(local_218,"AFTER_TIMEOUT");
            if (bVar2) {
              this->RepeatMode = AfterTimeout;
            }
          }
        }
        std::__cxx11::string::~string((string *)&local_238);
      }
      std::__cxx11::string::~string((string *)&n);
      local_3dc = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      poVar3 = std::operator<<((ostream *)local_3b0,"Repeat option invalid value: ");
      local_3b8 = local_e8.Value;
      poVar3 = ::operator<<(poVar3,local_e8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x21c,msg,false);
      std::__cxx11::string::~string(local_3d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      this_local._7_1_ = 0;
      local_3dc = 1;
    }
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&count);
    if (local_3dc != 0) goto LAB_0017f26a;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"ParallelLevel",&local_409);
  local_3e8 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_408);
  bVar2 = cmValue::operator_cast_to_bool(&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"ParallelLevel",&local_439);
    local_418 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_438);
    psVar4 = cmValue::operator_cast_to_string_(&local_418);
    level = std::__cxx11::stoi(psVar4,(size_t *)0x0,10);
    cmCTest::SetParallelLevel(pcVar1,level);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"StopOnFailure",&local_469);
  local_448 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_468);
  bVar2 = cmValue::operator_cast_to_bool(&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  if (bVar2) {
    cmCTest::SetStopOnFailure((this->super_cmCTestGenericHandler).CTest,true);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"LabelRegularExpression",&local_4a9);
  cmCTestGenericHandler::GetMultiOption(&local_488,&this->super_cmCTestGenericHandler,&local_4a8);
  BuildLabelRE(&local_488,&this->IncludeLabelRegularExpressions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"ExcludeLabelRegularExpression",
             (allocator<char> *)((long)&val.Value + 7));
  cmCTestGenericHandler::GetMultiOption(&local_4c8,&this->super_cmCTestGenericHandler,&local_4e8);
  BuildLabelRE(&local_4c8,&this->ExcludeLabelRegularExpressions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&val.Value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"IncludeRegularExpression",&local_519);
  local_4f8 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  bVar2 = cmValue::operator_cast_to_bool(&local_4f8);
  if (bVar2) {
    UseIncludeRegExp(this);
    psVar4 = cmValue::operator_cast_to_string_(&local_4f8);
    SetIncludeRegExp(this,psVar4);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"ExcludeRegularExpression",&local_549);
  local_528 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_548);
  local_4f8 = (cmValue)local_528;
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  bVar2 = cmValue::operator_cast_to_bool(&local_4f8);
  if (bVar2) {
    UseExcludeRegExp(this);
    psVar4 = cmValue::operator_cast_to_string_(&local_4f8);
    SetExcludeRegExp(this,psVar4);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"ExcludeFixtureRegularExpression",&local_579);
  local_558 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_578);
  local_4f8 = (cmValue)local_558;
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  bVar2 = cmValue::operator_cast_to_bool(&local_4f8);
  if (bVar2) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_4f8);
    std::__cxx11::string::operator=((string *)&this->ExcludeFixtureRegExp,(string *)psVar4);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"ExcludeFixtureSetupRegularExpression",&local_5a9);
  local_588 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_5a8);
  local_4f8 = (cmValue)local_588;
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  bVar2 = cmValue::operator_cast_to_bool(&local_4f8);
  if (bVar2) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_4f8);
    std::__cxx11::string::operator=((string *)&this->ExcludeFixtureSetupRegExp,(string *)psVar4);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"ExcludeFixtureCleanupRegularExpression",&local_5d9);
  local_5b8 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_5d8);
  local_4f8 = (cmValue)local_5b8;
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  bVar2 = cmValue::operator_cast_to_bool(&local_4f8);
  if (bVar2) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_4f8);
    std::__cxx11::string::operator=((string *)&this->ExcludeFixtureCleanupRegExp,(string *)psVar4);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"ResourceSpecFile",&local_609);
  local_5e8 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_608);
  local_4f8 = (cmValue)local_5e8;
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  bVar2 = cmValue::operator_cast_to_bool(&local_4f8);
  if (bVar2) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_4f8);
    std::__cxx11::string::operator=((string *)&this->ResourceSpecFile,(string *)psVar4);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"RerunFailed",&local_639);
  local_618 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_638);
  bVar2 = cmIsOn((cmValue)local_618);
  SetRerunFailed(this,bVar2);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  this_local._7_1_ = 1;
LAB_0017f26a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestTestHandler::ProcessOptions()
{
  // Update internal data structure from generic one
  this->SetTestsToRunInformation(this->GetOption("TestsToRunInformation"));
  this->SetUseUnion(cmIsOn(this->GetOption("UseUnion")));
  if (cmIsOn(this->GetOption("ScheduleRandom"))) {
    this->CTest->SetScheduleType("Random");
  }
  if (cmValue repeat = this->GetOption("Repeat")) {
    cmsys::RegularExpression repeatRegex(
      "^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    if (repeatRegex.find(repeat)) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->RepeatCount = static_cast<int>(n);
      if (this->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "UNTIL_FAIL") {
          this->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "UNTIL_PASS") {
          this->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "AFTER_TIMEOUT") {
          this->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Repeat option invalid value: " << repeat << std::endl);
      return false;
    }
  }
  if (this->GetOption("ParallelLevel")) {
    this->CTest->SetParallelLevel(std::stoi(this->GetOption("ParallelLevel")));
  }

  if (this->GetOption("StopOnFailure")) {
    this->CTest->SetStopOnFailure(true);
  }

  BuildLabelRE(this->GetMultiOption("LabelRegularExpression"),
               this->IncludeLabelRegularExpressions);
  BuildLabelRE(this->GetMultiOption("ExcludeLabelRegularExpression"),
               this->ExcludeLabelRegularExpressions);
  cmValue val = this->GetOption("IncludeRegularExpression");
  if (val) {
    this->UseIncludeRegExp();
    this->SetIncludeRegExp(val);
  }
  val = this->GetOption("ExcludeRegularExpression");
  if (val) {
    this->UseExcludeRegExp();
    this->SetExcludeRegExp(val);
  }
  val = this->GetOption("ExcludeFixtureRegularExpression");
  if (val) {
    this->ExcludeFixtureRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureSetupRegularExpression");
  if (val) {
    this->ExcludeFixtureSetupRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureCleanupRegularExpression");
  if (val) {
    this->ExcludeFixtureCleanupRegExp = *val;
  }
  val = this->GetOption("ResourceSpecFile");
  if (val) {
    this->ResourceSpecFile = *val;
  }
  this->SetRerunFailed(cmIsOn(this->GetOption("RerunFailed")));

  return true;
}